

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_micro.c
# Opt level: O0

void run_bench_get(char *path,size_t size,size_t extent_size,vmemcache_repl_p repl_p,uint n_threads,
                  os_thread_t *threads,uint ops_count,context *ctx)

{
  FILE *__stream;
  int iVar1;
  uint ops_per_thread_00;
  undefined8 uVar2;
  uint local_50;
  uint i_1;
  uint ops_per_thread;
  unsigned_long_long i;
  VMEMcache *pVStack_38;
  int cache_is_full;
  VMEMcache *cache;
  os_thread_t *threads_local;
  uint n_threads_local;
  vmemcache_repl_p repl_p_local;
  size_t extent_size_local;
  size_t size_local;
  char *path_local;
  
  cache = (VMEMcache *)threads;
  threads_local._0_4_ = n_threads;
  threads_local._4_4_ = repl_p;
  _n_threads_local = extent_size;
  extent_size_local = size;
  size_local = (size_t)path;
  pVStack_38 = bench_init(path,size,extent_size,repl_p,n_threads,ctx);
  i._4_4_ = 0;
  vmemcache_callback_on_evict(pVStack_38,on_evict_cb,(long)&i + 4);
  _i_1 = 0;
  while( true ) {
    if (i._4_4_ != 0) {
      ops_per_thread_00 = (uint)_i_1;
      vmemcache_callback_on_evict(pVStack_38,0);
      for (local_50 = 0; local_50 < (uint)threads_local; local_50 = local_50 + 1) {
        ctx[local_50].worker = worker_thread_get;
        ctx[local_50].ops_count = ops_per_thread_00;
      }
      printf("GET benchmark:\n");
      printf("==============\n");
      printf("\n");
      run_threads((uint)threads_local,(os_thread_t *)cache,ctx);
      print_bench_results("get",(uint)threads_local,ops_per_thread_00,ctx);
      bench_fini(pVStack_38);
      return;
    }
    iVar1 = vmemcache_put(ctx->cache,&i_1,8,ctx->buffs[_i_1 % (ulong)ctx->nbuffs].buff,
                          ctx->buffs[_i_1 % (ulong)ctx->nbuffs].size);
    if (iVar1 != 0) break;
    _i_1 = _i_1 + 1;
  }
  fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
          "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/benchmarks/bench_micro.c"
          ,0xe5,"run_bench_get");
  __stream = _stderr;
  uVar2 = vmemcache_errormsg();
  fprintf(__stream,"ERROR: vmemcache_put: %s",uVar2);
  fprintf(_stderr,"\n");
  abort();
}

Assistant:

static void
run_bench_get(const char *path, size_t size, size_t extent_size,
		enum vmemcache_repl_p repl_p,
		unsigned n_threads, os_thread_t *threads,
		unsigned ops_count, struct context *ctx)
{
	VMEMcache *cache = bench_init(path, size, extent_size,
					repl_p, n_threads, ctx);

	int cache_is_full = 0;
	vmemcache_callback_on_evict(cache, on_evict_cb, &cache_is_full);

	unsigned long long i = 0;
	while (!cache_is_full) {
		if (vmemcache_put(ctx->cache, &i, sizeof(i),
					ctx->buffs[i % ctx->nbuffs].buff,
					ctx->buffs[i % ctx->nbuffs].size))
			UT_FATAL("ERROR: vmemcache_put: %s",
					vmemcache_errormsg());
		i++;
	}

	unsigned ops_per_thread = (unsigned)i;

	vmemcache_callback_on_evict(cache, NULL, NULL);

	for (unsigned i = 0; i < n_threads; ++i) {
		ctx[i].worker = worker_thread_get;
		ctx[i].ops_count = ops_per_thread;
	}

	printf("GET benchmark:\n");
	printf("==============\n");
	printf("\n");

	run_threads(n_threads, threads, ctx);

	print_bench_results("get", n_threads, ops_per_thread, ctx);

	bench_fini(cache);
}